

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::cpp_function<void,SomeClass,double>
          (cpp_function *this,offset_in_SomeClass_to_subr f)

{
  function_record *rec;
  void *in_RDX;
  descr<24UL,_1UL> signature;
  char local_48 [32];
  type_info *local_28;
  undefined8 uStack_20;
  
  (this->super_function).super_object.super_handle.m_ptr = (PyObject *)0x0;
  rec = make_function_record(this);
  rec->data[0] = (void *)f;
  rec->data[1] = in_RDX;
  rec->impl = initialize<pybind11::cpp_function::initialize<void,SomeClass,double>(void(SomeClass::*)(double))::{lambda(pybind11::detail::function_call&)#1}(SomeClass*,double)#1},void,SomeClass*,double>(pybind11::cpp_function::initialize<void,SomeClass,double>(void(SomeClass::*)(double))::{lambda(pybind11::detail::function_call&)#1}(SomeClass*,double)#1}&&,void(*)(SomeClass*,double))
              ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  local_28 = (type_info *)&SomeClass::typeinfo;
  uStack_20 = 0;
  builtin_strncpy(local_48 + 0x10,"> {None}",9);
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48[0x1c] = '\0';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\0';
  builtin_strncpy(local_48,"({%}, {float}) -",0x10);
  initialize_generic(this,rec,local_48,&local_28,2);
  return;
}

Assistant:

cpp_function(Return (Class::*f)(Arg...), const Extra&... extra) {
        initialize([f](Class *c, Arg... args) -> Return { return (c->*f)(args...); },
                   (Return (*) (Class *, Arg...)) nullptr, extra...);
    }